

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall
r_comp::Decompiler::write_set
          (Decompiler *this,uint16_t read_index,bool aply_time_offset,uint16_t write_as_view_index)

{
  byte bVar1;
  ushort local_22;
  char local_20 [2];
  ushort local_1e;
  char local_1c [2];
  uint16_t i_1;
  ushort local_18;
  uint16_t i;
  byte local_13;
  uint16_t uStack_12;
  bool after_tail_wildcard;
  uint16_t arity;
  uint16_t write_as_view_index_local;
  bool aply_time_offset_local;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  i = write_as_view_index;
  local_13 = aply_time_offset;
  uStack_12 = read_index;
  _arity = this;
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  bVar1 = r_code::Atom::getAtomCount();
  local_18 = (ushort)bVar1;
  i_1._1_1_ = 0;
  if (local_18 == 1) {
    i_1._0_1_ = 0x5b;
    OutStream::push<char>(this->out_stream,(char *)&i_1,uStack_12);
    uStack_12 = uStack_12 + 1;
    write_any(this,uStack_12,(bool *)((long)&i_1 + 1),(bool)(local_13 & 1),0);
    local_1c[1] = 0x5d;
    OutStream::operator<<(this->out_stream,local_1c + 1);
  }
  else if ((i == 0) || (i != uStack_12)) {
    if ((this->horizontal_set & 1U) == 0) {
      OutStream::push<char[3]>(this->out_stream,(char (*) [3])0x1cae08,uStack_12);
      this->indents = this->indents + 3;
      for (local_22 = 0; local_22 < local_18; local_22 = local_22 + 1) {
        if ((i_1._1_1_ & 1) == 0) {
          write_indent(this,this->indents);
          uStack_12 = uStack_12 + 1;
          write_any(this,uStack_12,(bool *)((long)&i_1 + 1),(bool)(local_13 & 1),i);
        }
        else {
          uStack_12 = uStack_12 + 1;
          write_any(this,uStack_12,(bool *)((long)&i_1 + 1),(bool)(local_13 & 1),0);
        }
      }
      this->closing_set = true;
      this->indents = this->indents - 3;
    }
    else {
      local_1c[0] = '[';
      OutStream::push<char>(this->out_stream,local_1c,uStack_12);
      for (local_1e = 0; local_1e < local_18; local_1e = local_1e + 1) {
        if (local_1e != 0) {
          local_20[1] = 0x20;
          OutStream::operator<<(this->out_stream,local_20 + 1);
        }
        if ((i_1._1_1_ & 1) == 0) {
          uStack_12 = uStack_12 + 1;
          write_any(this,uStack_12,(bool *)((long)&i_1 + 1),(bool)(local_13 & 1),i);
        }
        else {
          uStack_12 = uStack_12 + 1;
          write_any(this,uStack_12,(bool *)((long)&i_1 + 1),(bool)(local_13 & 1),0);
        }
      }
      local_20[0] = ']';
      OutStream::operator<<(this->out_stream,local_20);
      this->closing_set = true;
    }
  }
  else {
    write_view(this,uStack_12,local_18);
  }
  return;
}

Assistant:

void Decompiler::write_set(uint16_t read_index, bool aply_time_offset, uint16_t write_as_view_index)   // read_index points to a set atom.
{
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    if (arity == 1) { // write [element]
        out_stream->push('[', read_index);
        write_any(++read_index, after_tail_wildcard, aply_time_offset);
        *out_stream << ']';
    } else if (write_as_view_index > 0 && write_as_view_index == read_index) {
        write_view(read_index, arity);
    } else if (horizontal_set) { // write [elements].
        out_stream->push('[', read_index);

        for (uint16_t i = 0; i < arity; ++i) {
            if (i > 0) {
                *out_stream << ' ';
            }

            if (after_tail_wildcard) {
                write_any(++read_index, after_tail_wildcard, aply_time_offset);
            } else {
                write_any(++read_index, after_tail_wildcard, aply_time_offset, write_as_view_index);
            }
        }

        *out_stream << ']';
        closing_set = true;
    } else { // write []+indented elements.
        out_stream->push("[]", read_index);
        indents += 3;

        for (uint16_t i = 0; i < arity; ++i) {
            if (after_tail_wildcard) {
                write_any(++read_index, after_tail_wildcard, aply_time_offset);
            } else {
                write_indent(indents);
                write_any(++read_index, after_tail_wildcard, aply_time_offset, write_as_view_index);
            }
        }

        closing_set = true;
        indents -= 3; // don't call write_indents() here as the last set member can be a set.
    }
}